

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

void dyn_tbl_get_heavy_key(dyn_tbl_t *dyn_tbl,longlong thresh,uchar *keys,int *num_key)

{
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> this;
  pointer ppVar3;
  undefined4 extraout_var;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  iterator it;
  int n;
  longlong bias;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_38;
  int local_2c;
  ulong local_28;
  int *local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_28 = (ulong)*(uint *)(in_RDI + 0x44);
  local_10 = in_RSI - local_28;
  local_2c = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    this._M_cur = (__node_type *)
                  std::
                  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                  ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::__detail::operator!=
                      (&local_38,
                       (_Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> *)
                       &stack0xffffffffffffffc0);
    if (!bVar1) break;
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true> *)
                        0x103ab9);
    iVar2 = std::abs((int)ppVar3->second);
    if (local_10 <= CONCAT44(extraout_var,iVar2)) {
      in_stack_ffffffffffffffb8 =
           (unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
            *)(local_18 + (ulong)((uint)(local_2c * *(int *)(local_8 + 0x58)) >> 3));
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)0x103af1);
      memcpy(in_stack_ffffffffffffffb8,ppVar3,(ulong)(*(uint *)(local_8 + 0x58) >> 3));
      local_2c = local_2c + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::
    operator++((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true> *)this._M_cur
              );
  }
  *local_20 = local_2c;
  return;
}

Assistant:

void dyn_tbl_get_heavy_key(dyn_tbl_t* dyn_tbl, long long thresh, unsigned char* keys, int* num_key) {
	long long bias = dyn_tbl->decrement;
	thresh = thresh - bias;
	//for(std::unordered_map<dyn_tbl_key_t, long long>::iterator it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
	int n = 0;
	for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
		if (abs(it->second) >= thresh) {
			memcpy(keys + n * dyn_tbl->lgn / 8, it->first.key, dyn_tbl->lgn / 8);
			n++;
			// dyn_tbl_key_t key = it->first;
			// ret.insert(key);
		}
	}

	*num_key = n;
}